

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsnode_dfs.c
# Opt level: O3

int_t zsnode_dfs(int jcol,int kcol,int_t *asub,int_t *xa_begin,int_t *xa_end,int_t *xprune,
                int *marker,GlobalLU_t *Glu)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int_t iVar4;
  int_t *piVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  undefined4 in_register_00000034;
  undefined8 uVar11;
  ulong uVar12;
  int next;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int_t nzlmax;
  int local_84;
  int local_80;
  int local_7c;
  int_t *local_78;
  long local_70;
  int local_64;
  long local_60;
  long local_58;
  int *local_50;
  int_t *local_48;
  int *local_40;
  int_t *local_38;
  
  uVar11 = CONCAT44(in_register_00000034,kcol);
  local_50 = Glu->xsup;
  local_40 = Glu->supno;
  piVar5 = Glu->lsub;
  local_78 = Glu->xlsub;
  local_84 = Glu->nzlmax;
  lVar10 = (long)jcol;
  local_58 = (long)local_40[lVar10];
  local_7c = local_40[lVar10] + 1;
  local_40[lVar10] = local_7c;
  next = local_78[lVar10];
  local_80 = jcol;
  local_60 = lVar10;
  local_48 = xprune;
  local_38 = xa_begin;
  if (jcol <= kcol) {
    local_64 = kcol + 1;
    do {
      lVar7 = (long)local_38[lVar10];
      local_70 = lVar10;
      if (local_38[lVar10] < xa_end[lVar10]) {
        do {
          iVar6 = asub[lVar7];
          if (marker[iVar6] != kcol) {
            marker[iVar6] = kcol;
            lVar8 = (long)next;
            next = next + 1;
            piVar5[lVar8] = iVar6;
            if (local_84 <= next) {
              iVar4 = zLUMemXpand(local_80,next,LSUB,&local_84,Glu);
              if (iVar4 != 0) {
                return iVar4;
              }
              piVar5 = Glu->lsub;
              lVar10 = local_70;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < xa_end[lVar10]);
      }
      local_40[lVar10] = local_7c;
      lVar10 = lVar10 + 1;
    } while (local_64 != (int)lVar10);
  }
  lVar10 = (long)kcol;
  local_70 = uVar11;
  iVar6 = next;
  if (local_80 < kcol) {
    iVar14 = local_78[local_60];
    iVar9 = next * 2 - iVar14;
    if (local_84 < iVar9) {
      do {
        iVar4 = zLUMemXpand(local_80,next,LSUB,&local_84,Glu);
        if (iVar4 != 0) {
          return iVar4;
        }
      } while (local_84 < iVar9);
      piVar5 = Glu->lsub;
      iVar14 = local_78[local_60];
    }
    if (iVar14 < next) {
      lVar7 = 0;
      do {
        piVar5[next + lVar7] = piVar5[iVar14 + lVar7];
        lVar7 = lVar7 + 1;
      } while ((long)next - (long)iVar14 != lVar7);
      iVar6 = (int)lVar7 + next;
    }
    auVar3 = _DAT_001111a0;
    auVar2 = _DAT_00111190;
    auVar1 = _DAT_00111180;
    lVar7 = (lVar10 - local_60) + -1;
    auVar13._8_4_ = (int)lVar7;
    auVar13._0_8_ = lVar7;
    auVar13._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar12 = 0;
    auVar13 = auVar13 ^ _DAT_001111a0;
    do {
      auVar15._8_4_ = (int)uVar12;
      auVar15._0_8_ = uVar12;
      auVar15._12_4_ = (int)(uVar12 >> 0x20);
      auVar16 = (auVar15 | auVar2) ^ auVar3;
      iVar14 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                  iVar14 < auVar16._4_4_) & 1)) {
        local_78[local_60 + uVar12 + 1] = next;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        local_78[local_60 + uVar12 + 2] = next;
      }
      auVar15 = (auVar15 | auVar1) ^ auVar3;
      iVar9 = auVar15._4_4_;
      if (iVar9 <= iVar14 && (iVar9 != iVar14 || auVar15._0_4_ <= auVar13._0_4_)) {
        local_78[local_60 + uVar12 + 3] = next;
        local_78[local_60 + uVar12 + 4] = next;
      }
      uVar12 = uVar12 + 4;
    } while (((lVar10 - local_60) + 3U & 0xfffffffffffffffc) != uVar12);
  }
  local_50[local_58 + 2] = (int)local_70 + 1;
  local_40[lVar10 + 1] = local_7c;
  local_48[lVar10] = iVar6;
  local_78[lVar10 + 1] = iVar6;
  return 0;
}

Assistant:

int_t
zsnode_dfs (
	   const int   jcol,	    /* in - start of the supernode */
	   const int   kcol, 	    /* in - end of the supernode */
	   const int_t *asub,        /* in */
	   const int_t *xa_begin,    /* in */
	   const int_t *xa_end,      /* in */
	   int_t      *xprune,      /* out */
	   int        *marker,      /* modified */
	   GlobalLU_t *Glu          /* modified */
	   )
{

    int_t i, k, ifrom, ito, nextl, new_next, nzlmax;
    int   nsuper, krow, kmark;
    int_t mem_error;
    int   *xsup, *supno;
    int_t *lsub, *xlsub;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    nsuper = ++supno[jcol];	/* Next available supernode number */
    nextl = xlsub[jcol];

    for (i = jcol; i <= kcol; i++) {
	/* For each nonzero in A[*,i] */
	for (k = xa_begin[i]; k < xa_end[i]; k++) {	
	    krow = asub[k];
	    kmark = marker[krow];
	    if ( kmark != kcol ) { /* First time visit krow */
		marker[krow] = kcol;
		lsub[nextl++] = krow;
		if ( nextl >= nzlmax ) {
		    mem_error = zLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu);
		    if ( mem_error ) return (mem_error);
		    lsub = Glu->lsub;
		}
	    }
    	}
	supno[i] = nsuper;
    }

    /* Supernode > 1, then make a copy of the subscripts for pruning */
    if ( jcol < kcol ) {
	new_next = nextl + (nextl - xlsub[jcol]);
	while ( new_next > nzlmax ) {
	    mem_error = zLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu);
	    if ( mem_error ) return (mem_error);
	    lsub = Glu->lsub;
	}
	ito = nextl;
	for (ifrom = xlsub[jcol]; ifrom < nextl; )
	    lsub[ito++] = lsub[ifrom++];	
        for (i = jcol+1; i <= kcol; i++) xlsub[i] = nextl;
	nextl = ito;
    }

    xsup[nsuper+1] = kcol + 1;
    supno[kcol+1]  = nsuper;
    xprune[kcol]   = nextl;
    xlsub[kcol+1]  = nextl;

    return 0;
}